

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int get_offset_field(flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
                    flatbuffers_uoffset_t *out)

{
  flatbuffers_voffset_t fVar1;
  uint uVar2;
  int c_2;
  int c_1;
  int c;
  flatbuffers_voffset_t vte;
  flatbuffers_uoffset_t k2;
  flatbuffers_uoffset_t k;
  flatbuffers_uoffset_t *out_local;
  int required_local;
  flatbuffers_voffset_t id_local;
  flatcc_table_verifier_descriptor_t *td_local;
  
  fVar1 = read_vt_entry(td,id);
  if (fVar1 == 0) {
    *out = 0;
    if (required == 0) {
      td_local._4_4_ = 0;
    }
    else {
      td_local._4_4_ = 4;
    }
  }
  else if ((uint)td->tsize < fVar1 + 4) {
    td_local._4_4_ = 0xd;
  }
  else {
    uVar2 = td->table + (uint)fVar1;
    if ((uVar2 & 3) == 0) {
      *out = uVar2;
      td_local._4_4_ = 0;
    }
    else {
      td_local._4_4_ = 0xc;
    }
  }
  return td_local._4_4_;
}

Assistant:

static int get_offset_field(flatcc_table_verifier_descriptor_t *td, voffset_t id, int required, uoffset_t *out)
{
    uoffset_t k, k2;
    voffset_t vte;

    vte = read_vt_entry(td, id);
    if (!vte) {
        *out = 0;
        if (required) {
            return flatcc_verify_error_required_field_missing;
        }
        /* Missing, but not invalid. */
        return flatcc_verify_ok;
    }
    /*
     * Note that we don't add td.table to k and we test against table
     * size not table end or buffer end. Otherwise it would not be safe
     * to optimized out the k <= k2 check for normal uoffset and voffset
     * configurations.
     */
    k = vte;
    k2 = k + offset_size;
    verify(k2 <= td->tsize, flatcc_verify_error_table_field_out_of_range);
    /* This normally optimizes to nop. */
    verify(uoffset_size > voffset_size || k <= k2, flatcc_verify_error_table_field_size_overflow);
    k += td->table;
    verify(!(k & (offset_size - 1u)), flatcc_verify_error_table_field_not_aligned);
    /* We assume the table size has already been verified. */
    *out = k;
    return flatcc_verify_ok;
}